

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O0

uint time_utils::slurp_digits(char **s,char until)

{
  char cVar1;
  int iVar2;
  InvalidDateTime *this;
  int digit;
  char c;
  uint r;
  char until_local;
  char **s_local;
  
  digit = 0;
  while( true ) {
    cVar1 = **s;
    *s = *s + 1;
    if (cVar1 == until) {
      return digit;
    }
    iVar2 = cVar1 + -0x30;
    if ((iVar2 < 0) || (9 < iVar2)) break;
    digit = digit * 10 + iVar2;
  }
  fprintf(_stderr,"Symbol: %c (until \'%c\')\n",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)until);
  this = (InvalidDateTime *)__cxa_allocate_exception(8);
  InvalidDateTime::InvalidDateTime(this);
  __cxa_throw(this,&InvalidDateTime::typeinfo,InvalidDateTime::~InvalidDateTime);
}

Assistant:

static inline
unsigned slurp_digits(const char *&s, char until)
{
    unsigned r = 0;
    while (true) {
        const char c = *s;
        ++s;
        if (c == until)
            break;
        const int digit = static_cast<int>(c) - '0';
        if (digit < 0 || digit > 9) {
            fprintf(stderr, "Symbol: %c (until '%c')\n", c, until);
            throw InvalidDateTime{};
        }
        r = r * 10 + digit;
    }
    return r;
}